

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

void __thiscall slang::ast::PortConnection::checkSimulatedNetTypes(PortConnection *this)

{
  SymbolKind SVar1;
  uint uVar2;
  PortSymbol *this_00;
  SourceLocation SVar3;
  Type *this_01;
  bool bVar4;
  Symbol *pSVar5;
  Diagnostic *pDVar6;
  int line;
  NetType *pNVar7;
  uint uVar8;
  uint uVar9;
  pointer pNVar10;
  NetType *pNVar11;
  long lVar12;
  NetType *udnt;
  uint uVar13;
  pointer pNVar14;
  bool shouldWarn_1;
  Scope *scope;
  bool shouldWarn;
  anon_class_16_2_f87c7f41 requireMatching;
  SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> external;
  SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> internal;
  bool local_129;
  Scope *local_128;
  ulong local_120;
  bitwidth_t local_118;
  uint local_114;
  char *local_110;
  PortConnection *local_108;
  anon_class_16_2_f87c7f41 local_100;
  NetType *local_f0;
  pointer local_e8;
  SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> local_e0 [2];
  SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> local_88 [2];
  
  getExpression(this);
  if (this->expr == (Expression *)0x0) {
    return;
  }
  bVar4 = Expression::bad(this->expr);
  if (bVar4) {
    return;
  }
  local_88[0].data_ = (pointer)local_88[0].firstElement;
  local_88[0].len = 0;
  local_88[0].cap = 4;
  this_00 = (PortSymbol *)this->port;
  SVar1 = (this_00->super_Symbol).kind;
  if (SVar1 == MultiPort) {
    SVar3 = this_00->externalLoc;
    if (SVar3 != (SourceLocation)0x0) {
      pSVar5 = this_00->internalSymbol;
      lVar12 = 0;
      do {
        PortSymbol::getNetTypes(*(PortSymbol **)((long)&pSVar5->kind + lVar12),local_88);
        lVar12 = lVar12 + 8;
      } while ((long)SVar3 << 3 != lVar12);
    }
  }
  else {
    if (SVar1 != Port) {
      assert::assertFailed
                ("T::isKind(kind)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                 ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::MultiPortSymbol]");
    }
    PortSymbol::getNetTypes(this_00,local_88);
  }
  local_e0[0].data_ = (pointer)local_e0[0].firstElement;
  local_e0[0].len = 0;
  local_e0[0].cap = 4;
  getNetRanges(this->expr,local_e0);
  if (local_88[0].len == 0) {
    if (local_e0[0].len == 0) goto LAB_001e1acc;
    local_128 = (this->parentInstance->super_InstanceSymbolBase).super_Symbol.parentScope;
    if (local_128 == (Scope *)0x0) goto LAB_001e1b1c;
  }
  else {
    local_128 = (this->parentInstance->super_InstanceSymbolBase).super_Symbol.parentScope;
    if (local_128 == (Scope *)0x0) {
LAB_001e1b1c:
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/PortSymbols.cpp"
                 ,0x739,"void slang::ast::PortConnection::checkSimulatedNetTypes() const");
    }
    if ((local_88[0].len == 1) && ((local_88[0].data_)->netType->netKind == Interconnect)) {
      pSVar5 = findAnyVars(this->expr);
      if (pSVar5 != (Symbol *)0x0) {
        pDVar6 = Scope::addDiag(local_128,(DiagCode)0x3c0006,this->expr->sourceRange);
        Diagnostic::operator<<(pDVar6,pSVar5->name);
        goto LAB_001e1acc;
      }
      if (local_88[0].len == 0) goto LAB_001e17ba;
    }
    pNVar14 = local_88[0].data_;
    pNVar10 = local_e0[0].data_;
    local_100.scope = &local_128;
    if (local_e0[0].len != 0) {
      if (local_e0[0].len != 1 || local_88[0].len != 1) {
        this_01 = (this->expr->type).ptr;
        local_108 = this;
        if (this_01 == (Type *)0x0) {
          local_100.this = this;
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                    );
        }
        local_100.this = this;
        local_118 = Type::getBitWidth(this_01);
        uVar13 = 0;
        local_110 = "exprWidth >= currBit + width";
        uVar9 = 0;
        do {
          pNVar7 = pNVar14->netType;
          pNVar11 = pNVar10->netType;
          local_f0 = pNVar7;
          if ((pNVar7->netKind == UserDefined) || (pNVar11->netKind == UserDefined)) {
            if (pNVar7 != pNVar11) {
              pDVar6 = Scope::addDiag(local_128,(DiagCode)0x9a0006,local_108->expr->sourceRange);
              pDVar6 = Diagnostic::operator<<(pDVar6,(pNVar7->super_Symbol).name);
              Diagnostic::operator<<(pDVar6,(pNVar11->super_Symbol).name);
              goto LAB_001e1acc;
            }
            local_129 = false;
          }
          else {
            NetType::getSimulatedNetType(pNVar7,pNVar11,&local_129);
          }
          uVar2 = pNVar14->width;
          uVar8 = pNVar10->width;
          if (uVar2 < uVar8) {
            pNVar10->width = uVar8 - uVar2;
LAB_001e1896:
            pNVar14 = pNVar14 + 1;
            uVar8 = uVar2;
          }
          else {
            pNVar10 = pNVar10 + 1;
            if (uVar2 - uVar8 == 0) goto LAB_001e1896;
            pNVar14->width = uVar2 - uVar8;
          }
          local_114 = uVar13;
          local_e8 = pNVar14;
          if (local_129 == true) {
            uVar13 = local_118 - (uVar8 + uVar9);
            if (local_118 < uVar8 + uVar9) {
              line = 0x7ce;
              goto LAB_001e1b04;
            }
            pDVar6 = Scope::addDiag(local_128,(DiagCode)0xb00006,local_108->expr->sourceRange);
            Diagnostic::operator<<(pDVar6,(pNVar11->super_Symbol).name);
            local_120 = (ulong)(~uVar9 + local_118);
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
            ::emplace_back<unsigned_long>(&pDVar6->args,&local_120);
            local_120 = (ulong)uVar13;
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
            ::emplace_back<unsigned_long>(&pDVar6->args,&local_120);
            Diagnostic::operator<<(pDVar6,(local_f0->super_Symbol).name);
            uVar13 = (uint)CONCAT71((int7)((ulong)pNVar11 >> 8),1);
            if ((local_114 & 1) == 0) {
              Diagnostic::addNote(pDVar6,(DiagCode)0x40001,local_108->port->location);
            }
          }
          if (local_e8 == local_88[0].data_ + local_88[0].len) {
            if (pNVar10 == local_e0[0].data_ + local_e0[0].len) goto LAB_001e1acc;
LAB_001e19b9:
            line = 0x7de;
            local_110 = "in == internal.end() && ex == external.end()";
LAB_001e1b04:
            assert::assertFailed
                      (local_110,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/PortSymbols.cpp"
                       ,line,"void slang::ast::PortConnection::checkSimulatedNetTypes() const");
          }
          if (pNVar10 == local_e0[0].data_ + local_e0[0].len) goto LAB_001e19b9;
          uVar9 = uVar8 + uVar9;
          pNVar14 = local_e8;
        } while( true );
      }
      pNVar7 = (local_88[0].data_)->netType;
      pNVar11 = (local_e0[0].data_)->netType;
      local_100.this = this;
      if (pNVar7 != pNVar11) {
        if (pNVar7->netKind == UserDefined) {
          udnt = pNVar7;
          if (pNVar11->netKind == UserDefined) {
            pDVar6 = Scope::addDiag(local_128,(DiagCode)0x9b0006,this->expr->sourceRange);
            pDVar6 = Diagnostic::operator<<(pDVar6,(pNVar7->super_Symbol).name);
            Diagnostic::operator<<(pDVar6,(pNVar11->super_Symbol).name);
            goto LAB_001e1acc;
          }
        }
        else {
          udnt = pNVar11;
          if (pNVar11->netKind != UserDefined) {
            NetType::getSimulatedNetType(pNVar7,pNVar11,(bool *)&local_120);
            if (local_120._0_1_ == true) {
              pDVar6 = Scope::addDiag(local_128,(DiagCode)0xaf0006,this->expr->sourceRange);
              Diagnostic::operator<<(pDVar6,(pNVar11->super_Symbol).name);
              Diagnostic::operator<<(pDVar6,(pNVar7->super_Symbol).name);
              Diagnostic::addNote(pDVar6,(DiagCode)0x40001,this->port->location);
            }
            goto LAB_001e1acc;
          }
        }
        checkSimulatedNetTypes::anon_class_16_2_f87c7f41::operator()(&local_100,udnt);
      }
      goto LAB_001e1acc;
    }
    lVar12 = 0;
    do {
      pNVar7 = *(NetType **)((long)&(local_88[0].data_)->netType + lVar12);
      if (pNVar7->netKind == UserDefined) goto LAB_001e17bc;
      lVar12 = lVar12 + 0x10;
    } while (local_88[0].len * 0x10 != lVar12);
  }
LAB_001e17ba:
  pNVar7 = (NetType *)0x0;
LAB_001e17bc:
  local_100.scope = &local_128;
  if (local_e0[0].len != 0) {
    lVar12 = 0;
    do {
      pNVar11 = *(NetType **)((long)&(local_e0[0].data_)->netType + lVar12);
      if (pNVar11->netKind == UserDefined) goto LAB_001e17ee;
      lVar12 = lVar12 + 0x10;
    } while (local_e0[0].len * 0x10 != lVar12);
  }
  pNVar11 = pNVar7;
  local_100.this = this;
  if (pNVar7 != (NetType *)0x0) {
LAB_001e17ee:
    local_100.this = this;
    checkSimulatedNetTypes::anon_class_16_2_f87c7f41::operator()(&local_100,pNVar11);
  }
LAB_001e1acc:
  if (local_e0[0].data_ != (pointer)local_e0[0].firstElement) {
    free(local_e0[0].data_);
  }
  if (local_88[0].data_ != (pointer)local_88[0].firstElement) {
    free(local_88[0].data_);
  }
  return;
}

Assistant:

void PortConnection::checkSimulatedNetTypes() const {
    getExpression();
    if (!expr || expr->bad())
        return;

    SmallVector<PortSymbol::NetTypeRange, 4> internal;
    if (port.kind == SymbolKind::Port)
        port.as<PortSymbol>().getNetTypes(internal);
    else {
        for (auto p : port.as<MultiPortSymbol>().ports)
            p->getNetTypes(internal);
    }

    SmallVector<PortSymbol::NetTypeRange, 4> external;
    getNetRanges(*expr, external);

    // There might not be any nets, in which case we should just leave.
    if (internal.empty() && external.empty())
        return;

    auto scope = parentInstance.getParentScope();
    ASSERT(scope);

    // Do additional checking on the expression for interconnect port connections.
    if (internal.size() == 1 && internal[0].netType->netKind == NetType::Interconnect) {
        if (auto sym = findAnyVars(*expr)) {
            scope->addDiag(diag::InterconnectPortVar, expr->sourceRange) << sym->name;
            return;
        }
    }

    auto requireMatching = [&](const NetType& udnt) {
        // Types are more restricted; they must match instead of just being
        // assignment compatible. Also direction must be input or output.
        // We need to do this dance to get at the type of the connection prior
        // to it being converted to match the type of the port.
        auto exprType = expr->type.get();
        if (expr->kind == ExpressionKind::Conversion) {
            auto& conv = expr->as<ConversionExpression>();
            if (conv.isImplicit())
                exprType = conv.operand().type;
        }
        else if (expr->kind == ExpressionKind::Assignment) {
            auto& assign = expr->as<AssignmentExpression>();
            if (assign.isLValueArg())
                exprType = assign.left().type;
        }

        auto [direction, type] = getDirAndType(port);
        if (!type->isMatching(*exprType)) {
            // If this is from an interconnect connection, don't require matching types.
            auto isInterconnect = [](const Type& t) {
                auto curr = &t;
                while (curr->isArray())
                    curr = curr->getArrayElementType();

                return curr->isUntypedType();
            };

            if (isInterconnect(*type) || isInterconnect(*exprType))
                return;

            auto& diag = scope->addDiag(diag::MismatchedUserDefPortConn, expr->sourceRange);
            diag << udnt.name;
            diag << *type;
            diag << *exprType;
        }
        else if (direction != ArgumentDirection::In && direction != ArgumentDirection::Out) {
            auto& diag = scope->addDiag(diag::MismatchedUserDefPortDir, expr->sourceRange);
            diag << udnt.name;
        }
    };

    // If only one side has net types, check for user-defined nettypes,
    // which impose additional restrictions on the connection.
    if (internal.empty() || external.empty()) {
        const NetType* udnt = nullptr;
        auto checker = [&](auto& list) {
            for (auto& ntr : list) {
                if (!ntr.netType->isBuiltIn()) {
                    udnt = ntr.netType;
                    break;
                }
            }
        };

        checker(internal);
        checker(external);
        if (udnt)
            requireMatching(*udnt);

        return;
    }

    // Simple case is one net connected on each side.
    if (internal.size() == 1 && external.size() == 1) {
        auto& inNt = *internal[0].netType;
        auto& exNt = *external[0].netType;
        if (&inNt == &exNt)
            return;

        if (!inNt.isBuiltIn() || !exNt.isBuiltIn()) {
            // If both sides are user-defined nettypes they need to match.
            if (!inNt.isBuiltIn() && !exNt.isBuiltIn()) {
                auto& diag = scope->addDiag(diag::UserDefPortTwoSided, expr->sourceRange);
                diag << inNt.name << exNt.name;
            }
            else if (!inNt.isBuiltIn()) {
                requireMatching(inNt);
            }
            else {
                requireMatching(exNt);
            }
        }
        else {
            // Otherwise both sides are built-in nettypes.
            bool shouldWarn;
            NetType::getSimulatedNetType(inNt, exNt, shouldWarn);
            if (shouldWarn) {
                auto& diag = scope->addDiag(diag::NetInconsistent, expr->sourceRange);
                diag << exNt.name;
                diag << inNt.name;
                diag.addNote(diag::NoteDeclarationHere, port.location);
            }
        }

        return;
    }

    // Otherwise we need to compare ranges of net types for differences.
    auto in = internal.begin();
    auto ex = external.begin();
    bitwidth_t currBit = 0;
    bitwidth_t exprWidth = expr->type->getBitWidth();
    bool shownDeclaredHere = false;

    while (true) {
        bool shouldWarn;
        auto& inNt = *in->netType;
        auto& exNt = *ex->netType;

        if (!inNt.isBuiltIn() || !exNt.isBuiltIn()) {
            if (&inNt != &exNt) {
                scope->addDiag(diag::UserDefPortMixedConcat, expr->sourceRange)
                    << inNt.name << exNt.name;
                return;
            }
            shouldWarn = false;
        }
        else {
            NetType::getSimulatedNetType(inNt, exNt, shouldWarn);
        }

        bitwidth_t width;
        if (in->width < ex->width) {
            width = in->width;
            ex->width -= width;
            in++;
        }
        else {
            width = ex->width;
            ex++;

            if (in->width == width)
                in++;
            else
                in->width -= width;
        }

        if (shouldWarn) {
            ASSERT(exprWidth >= currBit + width);
            bitwidth_t left = exprWidth - currBit - 1;
            bitwidth_t right = left - (width - 1);

            auto& diag = scope->addDiag(diag::NetRangeInconsistent, expr->sourceRange);
            diag << exNt.name;
            diag << left << right;
            diag << inNt.name;

            if (!shownDeclaredHere) {
                diag.addNote(diag::NoteDeclarationHere, port.location);
                shownDeclaredHere = true;
            }
        }

        if (in == internal.end() || ex == external.end()) {
            ASSERT(in == internal.end() && ex == external.end());
            break;
        }

        currBit += width;
    }
}